

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdCompSort(int *pPrios,uint *uSupps,unsigned_short *piLits,int nVars,uint *piLitsRes)

{
  int iVar1;
  int local_110;
  int local_10c;
  int local_108;
  int PrioMax;
  int SuppMax;
  int iVarBest;
  int k;
  int i;
  int pOrder [16];
  int Priority [16];
  int nSuppSizes [16];
  uint *piLitsRes_local;
  int nVars_local;
  unsigned_short *piLits_local;
  uint *uSupps_local;
  int *pPrios_local;
  
  for (iVarBest = 0; iVarBest < nVars; iVarBest = iVarBest + 1) {
    if (uSupps[iVarBest] == 0) {
      __assert_fail("uSupps[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x5d8,
                    "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                   );
    }
    (&k)[iVarBest] = iVarBest;
    pOrder[(long)iVarBest + 0xe] = 100000000;
    for (SuppMax = 0; SuppMax < 0x10; SuppMax = SuppMax + 1) {
      if ((uSupps[iVarBest] & 1 << ((byte)SuppMax & 0x1f)) != 0) {
        if (pOrder[(long)iVarBest + 0xe] < pPrios[SuppMax]) {
          local_110 = pOrder[(long)iVarBest + 0xe];
        }
        else {
          local_110 = pPrios[SuppMax];
        }
        pOrder[(long)iVarBest + 0xe] = local_110;
      }
    }
    if (pOrder[(long)iVarBest + 0xe] == 0x10) {
      __assert_fail("Priority[i] != 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x5de,
                    "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                   );
    }
    iVar1 = Kit_WordCountOnes(uSupps[iVarBest]);
    Priority[(long)iVarBest + 0xe] = iVar1;
  }
  Extra_BubbleSort(&k,pOrder + 0xe,nVars,0);
  PrioMax = -1;
  local_108 = 0;
  local_10c = 0;
  for (iVarBest = 0; iVarBest < nVars; iVarBest = iVarBest + 1) {
    if ((local_108 < Priority[(long)iVarBest + 0xe]) ||
       ((local_108 == Priority[(long)iVarBest + 0xe] && (local_10c < pOrder[(long)iVarBest + 0xe])))
       ) {
      local_108 = Priority[(long)iVarBest + 0xe];
      local_10c = pOrder[(long)iVarBest + 0xe];
      PrioMax = iVarBest;
    }
  }
  if (PrioMax == -1) {
    __assert_fail("iVarBest != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x5f0,
                  "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                 );
  }
  SuppMax = 1;
  *piLitsRes = (uint)piLits[PrioMax];
  for (iVarBest = 0; iVarBest < nVars; iVarBest = iVarBest + 1) {
    if ((&k)[iVarBest] != PrioMax) {
      piLitsRes[SuppMax] = (uint)piLits[(&k)[iVarBest]];
      SuppMax = SuppMax + 1;
    }
  }
  if (SuppMax != nVars) {
    __assert_fail("k == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x5fa,
                  "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                 );
  }
  return;
}

Assistant:

void Kit_DsdCompSort( int pPrios[], unsigned uSupps[], unsigned short * piLits, int nVars, unsigned piLitsRes[] )
{
    int nSuppSizes[16], Priority[16], pOrder[16];
    int i, k, iVarBest, SuppMax, PrioMax;
    // compute support sizes and priorities of the components
    for ( i = 0; i < nVars; i++ )
    {
        assert( uSupps[i] );
        pOrder[i] = i;
        Priority[i] = KIT_INFINITY;
        for ( k = 0; k < 16; k++ )
            if ( uSupps[i] & (1 << k) )
                Priority[i] = KIT_MIN( Priority[i], pPrios[k] );
        assert( Priority[i] != 16 );
        nSuppSizes[i] = Kit_WordCountOnes(uSupps[i]);
    }
    // sort the components by pririty
    Extra_BubbleSort( pOrder, Priority, nVars, 0 );
    // find the component by with largest size and lowest priority
    iVarBest = -1;
    SuppMax  = 0;
    PrioMax  = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( SuppMax < nSuppSizes[i] || (SuppMax == nSuppSizes[i] && PrioMax < Priority[i]) )
        {
            SuppMax  = nSuppSizes[i];
            PrioMax  = Priority[i];
            iVarBest = i;
        }
    }
    assert( iVarBest != -1 );
    // copy the resulting literals
    k = 0;
    piLitsRes[k++] = piLits[iVarBest];
    for ( i = 0; i < nVars; i++ )
    {
        if ( pOrder[i] == iVarBest )
            continue;
        piLitsRes[k++] = piLits[pOrder[i]];
    }
    assert( k == nVars );
}